

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

string * __thiscall
iutest::PrintToStrings<int,int>
          (string *__return_storage_ptr__,iutest *this,char *separate,int *v,int args)

{
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  std::ostream::operator<<(local_1a8 + 0x10,*(int *)separate);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a8);
  std::ostream::operator<<(local_1a8 + 0x10,(int)v);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_1c8);
  if (local_1c8 != local_1b8) {
    operator_delete(local_1c8,local_1b8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string PrintToStrings(const char* separate, const T& v, Args... args)
{
    ::std::string str = PrintToString(v);
    str += separate;
    str += PrintToStrings(separate, args...);
    return str;
}